

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool waitForVisibilityNotify(_GLFWwindow *window)

{
  int iVar1;
  GLFWbool GVar2;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  double timeout;
  XEvent dummy;
  undefined8 uVar3;
  undefined1 local_d0 [192];
  long local_10;
  
  uVar3 = 0x3fb999999999999a;
  local_10 = in_RDI;
  do {
    iVar1 = XCheckTypedWindowEvent
                      (_glfw.x11.display,*(undefined8 *)(local_10 + 0x340),0xf,local_d0,in_R8,in_R9,
                       uVar3);
    if (iVar1 != 0) {
      return 1;
    }
    GVar2 = waitForEvent((double *)dummy.xerror.resourceid);
  } while (GVar2 != 0);
  return 0;
}

Assistant:

static GLFWbool waitForVisibilityNotify(_GLFWwindow* window)
{
    XEvent dummy;
    double timeout = 0.1;

    while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                   window->x11.handle,
                                   VisibilityNotify,
                                   &dummy))
    {
        if (!waitForEvent(&timeout))
            return GLFW_FALSE;
    }

    return GLFW_TRUE;
}